

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

int scv_i_grow(scv_vector *v,size_t capacity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  void *pvVar5;
  ulong local_30;
  size_t newcapacity;
  void *newdata;
  size_t capacity_local;
  scv_vector *v_local;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x3a,"int scv_i_grow(struct scv_vector *, size_t)");
  }
  if (v->data != (void *)0x0) {
    if (v->capacity < capacity) {
      if (v->objsize == 0) {
        __assert_fail("v->objsize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x41,
                      "int scv_i_grow(struct scv_vector *, size_t)");
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = v->objsize;
      if (capacity < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0)) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = v->objsize;
        if (v->capacity < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar2,0)) {
          lVar4 = v->capacity + v->capacity;
        }
        else {
          lVar4 = v->capacity + (v->capacity >> 1);
        }
        local_30 = lVar4 + 1;
        if ((local_30 < capacity) ||
           (auVar3._8_8_ = 0, auVar3._0_8_ = v->objsize,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) <= local_30)) {
          local_30 = capacity;
        }
        pvVar5 = realloc(v->data,local_30 * v->objsize);
        if (pvVar5 == (void *)0x0) {
          v_local._4_4_ = -2;
        }
        else {
          v->data = pvVar5;
          v->capacity = local_30;
          v_local._4_4_ = 0;
        }
      }
      else {
        v_local._4_4_ = -3;
      }
    }
    else {
      v_local._4_4_ = 0;
    }
    return v_local._4_4_;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x3b,
                "int scv_i_grow(struct scv_vector *, size_t)");
}

Assistant:

static int scv_i_grow(struct scv_vector *v, size_t capacity)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (capacity <= v->capacity) {
		return SCV_OK;
	}

	assert(v->objsize > 0);

	if (capacity >= (size_t) -1 / v->objsize) {
		return SCV_ERANGE;
	}

	/* Growth factor 2 for small vectors, 1.5 for larger */
	if (v->capacity < 4096 / v->objsize) {
		newcapacity = v->capacity + v->capacity + 1;
	}
	else {
		newcapacity = v->capacity + v->capacity / 2 + 1;
	}

	if (capacity > newcapacity || newcapacity >= (size_t) -1 / v->objsize) {
		newcapacity = capacity;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}